

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testMultiPartApi.cpp
# Opt level: O2

void anon_unknown.dwarf_1d7349::fillPixels<float>(Array2D<float> *ph,int width,int height)

{
  long lVar1;
  float *pfVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  Imf_3_2::Array2D<float>::resizeErase(ph,(long)height,(long)width);
  uVar3 = 0;
  uVar4 = 0;
  if (0 < width) {
    uVar4 = (ulong)(uint)width;
  }
  uVar7 = (ulong)(uint)height;
  if (height < 1) {
    uVar7 = uVar3;
  }
  lVar5 = 0;
  for (uVar6 = 0; uVar6 != uVar7; uVar6 = uVar6 + 1) {
    lVar1 = ph->_sizeY;
    pfVar2 = ph->_data;
    for (uVar8 = 0; uVar4 != uVar8; uVar8 = uVar8 + 1) {
      *(float *)((long)pfVar2 + uVar8 * 4 + lVar1 * lVar5) =
           (float)(((int)uVar3 + (int)uVar8) % 0x801);
    }
    lVar5 = lVar5 + 4;
    uVar3 = uVar3 + (uint)width;
  }
  return;
}

Assistant:

void
fillPixels (Array2D<T>& ph, int width, int height)
{
    ph.resizeErase (height, width);
    for (int y = 0; y < height; ++y)
        for (int x = 0; x < width; ++x)
        {
            //
            // We do this because half cannot store number bigger than 2048 exactly.
            //
            ph[y][x] = (y * width + x) % 2049;
        }
}